

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool quality_action(menu_conflict *m,ui_event *event,wchar_t oid)

{
  ui_event uVar1;
  ui_event_type local_130;
  ui_event_type uStack_114;
  wchar_t count;
  ui_event evt;
  region_conflict area;
  menu_iter menu_f;
  menu_conflict menu;
  wchar_t oid_local;
  ui_event *event_local;
  menu_conflict *m_local;
  
  memcpy(&area.width,&DAT_002f45e8,0x28);
  area.col = 0x1d;
  area.row = 5;
  evt._8_4_ = oid + L'\x02';
  evt.key.code = 0x25;
  screen_save();
  menu_init((menu_conflict *)&menu_f.resize,MN_SKIN_SCROLL,(menu_iter *)&area.width);
  menu_setpriv((menu_conflict *)&menu_f.resize,5,quality_values);
  if (Term->hgt + -1 < evt._8_4_ + (int)menu.filter_list) {
    evt._8_4_ = (Term->hgt + -1) - (int)menu.filter_list;
  }
  menu_layout((menu_conflict *)&menu_f.resize,(region_conflict *)&evt.mouse.x);
  window_make(evt.key.code + L'\xfffffffe',evt._8_4_ + L'\xffffffff',evt.key.code + 2 + area.col,
              evt._8_4_ + area.row);
  uVar1 = menu_select((menu_conflict *)&menu_f.resize,0,true);
  local_130 = CONCAT31(local_130._1_3_,uVar1.key.mods);
  evt.type = local_130;
  uStack_114 = uVar1.type;
  if (uStack_114 == EVT_SELECT) {
    ignore_level[oid] = (uint8_t)menu.row_funcs;
  }
  screen_load();
  return true;
}

Assistant:

static bool quality_action(struct menu *m, const ui_event *event, int oid)
{
	struct menu menu;
	menu_iter menu_f = { NULL, NULL, quality_subdisplay, NULL, NULL };
	region area = { 37, 2, 29, IGNORE_MAX };
	ui_event evt;
	int count;

	/* Display at the right point */
	area.row += oid;

	/* Save */
	screen_save();

	/* Work out how many options we have */
	count = IGNORE_MAX;

	/* Run menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu_setpriv(&menu, count, quality_values);

	/* Stop menus from going off the bottom of the screen */
	if (area.row + menu.count > Term->hgt - 1)
		area.row += Term->hgt - 1 - area.row - menu.count;

	menu_layout(&menu, &area);

	window_make(area.col - 2, area.row - 1, area.col + area.width + 2,
				area.row + area.page_rows);

	evt = menu_select(&menu, 0, true);

	/* Set the new value appropriately */
	if (evt.type == EVT_SELECT)
		ignore_level[oid] = menu.cursor;

	/* Load and finish */
	screen_load();
	return true;
}